

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  anon_union_8_5_2195ba05_for_data_ aVar2;
  pointer __src;
  size_t __n;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  const_reference pUVar7;
  byte *ptr;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  string_view s;
  
  iVar4 = SooRep::size((SooRep *)unknown_fields,
                       (undefined1  [16])
                       ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                       (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      pUVar7 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,iVar4);
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      switch(pUVar7->type_) {
      case 0:
        uVar10 = (pUVar7->data_).varint;
        uVar8 = pUVar7->number_ << 3;
        uVar6 = uVar8;
        if (0x7f < uVar8) {
          do {
            *target = (byte)uVar6 | 0x80;
            uVar8 = uVar6 >> 7;
            target = target + 1;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar8;
          } while (bVar3);
        }
        *target = (byte)uVar8;
        ptr = target + 1;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *ptr = (byte)uVar9 | 0x80;
            uVar10 = uVar9 >> 7;
            ptr = ptr + 1;
            bVar3 = 0x3fff < uVar9;
            uVar9 = uVar10;
          } while (bVar3);
        }
        *ptr = (byte)uVar10;
        goto LAB_00319001;
      case 1:
        uVar1 = (pUVar7->data_).fixed32;
        uVar10 = (ulong)(pUVar7->number_ * 8 + 5);
        if (0x7f < pUVar7->number_ << 3) {
          do {
            uVar6 = (uint)uVar10;
            *target = (byte)uVar10 | 0x80;
            uVar10 = uVar10 >> 7;
            target = target + 1;
          } while (0x3fff < uVar6);
        }
        *target = (byte)uVar10;
        *(uint32_t *)(target + 1) = uVar1;
        target = target + 5;
        break;
      case 2:
        aVar2 = pUVar7->data_;
        uVar10 = (ulong)(pUVar7->number_ * 8 + 1);
        if (0x7f < pUVar7->number_ << 3) {
          do {
            uVar6 = (uint)uVar10;
            *target = (byte)uVar10 | 0x80;
            uVar10 = uVar10 >> 7;
            target = target + 1;
          } while (0x3fff < uVar6);
        }
        *target = (byte)uVar10;
        *(anon_union_8_5_2195ba05_for_data_ *)(target + 1) = aVar2;
        target = target + 9;
        break;
      case 3:
        __src = (((pUVar7->data_).string_value)->_M_dataplus)._M_p;
        __n = ((pUVar7->data_).string_value)->_M_string_length;
        if ((long)__n < 0x80) {
          uVar6 = pUVar7->number_ * 8;
          lVar12 = 1;
          if (((0x7f < uVar6) && (lVar12 = 2, 0x3fff < uVar6)) && (lVar12 = 3, 0x1fffff < uVar6)) {
            lVar12 = 5 - (ulong)(uVar6 < 0x10000000);
          }
          if ((long)__n <= (long)(stream->end_ + ~(ulong)(target + lVar12) + 0x10)) {
            uVar11 = uVar6 | 2;
            uVar8 = uVar11;
            if (0x7f < uVar6) {
              do {
                *target = (byte)uVar8 | 0x80;
                uVar11 = uVar8 >> 7;
                target = target + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar11;
              } while (bVar3);
            }
            *target = (byte)uVar11;
            target[1] = (byte)__n;
            memcpy(target + 2,__src,__n);
            target = target + __n + 2;
            break;
          }
        }
        s._M_str = __src;
        s._M_len = __n;
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,pUVar7->number_,s,target);
        break;
      case 4:
        uVar10 = (ulong)(pUVar7->number_ * 8 + 3);
        if (0x7f < pUVar7->number_ << 3) {
          do {
            uVar6 = (uint)uVar10;
            *target = (byte)uVar10 | 0x80;
            uVar10 = uVar10 >> 7;
            target = target + 1;
          } while (0x3fff < uVar6);
        }
        *target = (byte)uVar10;
        if (pUVar7->type_ != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x174,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        ptr = InternalSerializeUnknownFieldsToArray((pUVar7->data_).group,target + 1,stream);
        if (stream->end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
        }
        uVar10 = (ulong)(pUVar7->number_ * 8 + 4);
        if (0x7f < pUVar7->number_ << 3) {
          do {
            uVar6 = (uint)uVar10;
            *ptr = (byte)uVar10 | 0x80;
            uVar10 = uVar10 >> 7;
            ptr = ptr + 1;
          } while (0x3fff < uVar6);
        }
        *ptr = (byte)uVar10;
LAB_00319001:
        target = ptr + 1;
      }
      iVar4 = iVar4 + 1;
      iVar5 = SooRep::size((SooRep *)unknown_fields,
                           (undefined1  [16])
                           ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
    } while (iVar4 < iVar5);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}